

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  int iVar1;
  secp256k1_scratch *scratch;
  long lVar2;
  ulong uVar3;
  code *pcVar4;
  secp256k1_strauss_point_state *psVar5;
  long extraout_RDX;
  secp256k1_strauss_point_state *scratch_00;
  size_t sVar6;
  secp256k1_gej *r;
  ulong uVar7;
  uchar *out32;
  secp256k1_gej *psVar8;
  secp256k1_strauss_point_state *scratch_01;
  secp256k1_gej *psVar9;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *elem;
  code *cb;
  secp256k1_strauss_point_state *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *acc;
  secp256k1_callback *error_callback;
  secp256k1_ge *unaff_R13;
  ulong uVar10;
  secp256k1_scalar *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_strauss_point_state *r_00;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej pj;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  ulong uStack_2090;
  secp256k1_strauss_state sStack_2088;
  secp256k1_fe asStack_2070 [8];
  secp256k1_strauss_point_state sStack_1f30;
  secp256k1_ge asStack_1b20 [8];
  secp256k1_callback *psStack_1850;
  secp256k1_gej *psStack_1848;
  secp256k1_strauss_point_state *psStack_1840;
  secp256k1_strauss_point_state *psStack_1838;
  secp256k1_strauss_point_state *psStack_1830;
  size_t sStack_1820;
  undefined1 auStack_1808 [8];
  undefined1 auStack_1800 [88];
  secp256k1_gej sStack_17a8;
  secp256k1_gej sStack_1728;
  secp256k1_gej sStack_16a8;
  secp256k1_gej sStack_1628;
  secp256k1_gej asStack_15a8 [2];
  secp256k1_strauss_point_state sStack_1468;
  secp256k1_gej sStack_1058;
  secp256k1_gej sStack_fd8;
  undefined1 auStack_f58 [720];
  secp256k1_sha256 *psStack_c88;
  undefined1 *puStack_c80;
  secp256k1_gej *psStack_c78;
  secp256k1_gej *psStack_c70;
  code *apcStack_c68 [2];
  int iStack_c56;
  undefined2 uStack_c52;
  secp256k1_gej *psStack_c50;
  long lStack_c48;
  undefined1 auStack_c40 [40];
  int aiStack_c18 [6];
  secp256k1_sha256 sStack_c00;
  secp256k1_sha256 sStack_b90;
  secp256k1_gej *psStack_b28;
  secp256k1_fe *psStack_b20;
  secp256k1_ge *psStack_b18;
  secp256k1_ge *psStack_b10;
  secp256k1_gej *psStack_b08;
  secp256k1_strauss_point_state *psStack_b00;
  undefined1 auStack_af8 [32];
  undefined1 local_ad8 [40];
  uint64_t uStack_ab0;
  uint64_t local_aa8;
  uint64_t uStack_aa0;
  uint64_t local_a98;
  uint64_t local_a90;
  uint64_t uStack_a88;
  uint64_t local_a80;
  uint64_t uStack_a78;
  uint64_t local_a70;
  int local_a68 [12];
  secp256k1_strauss_state local_a38;
  secp256k1_gej local_a20;
  secp256k1_gej local_9a0;
  secp256k1_gej local_920;
  secp256k1_ge local_8a0;
  secp256k1_fe local_848 [8];
  secp256k1_ge local_708 [8];
  secp256k1_strauss_point_state local_448;
  
  psVar12 = (secp256k1_gej *)auStack_af8;
  psVar5 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar11 = (secp256k1_scalar *)local_ad8;
  psStack_b00 = (secp256k1_strauss_point_state *)0x169483;
  testutil_random_scalar_order_test(psVar11);
  psStack_b00 = (secp256k1_strauss_point_state *)0x169494;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_af8,psVar11,target);
  psStack_b00 = (secp256k1_strauss_point_state *)0x16949f;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_af8,(secp256k1_scalar *)auStack_af8);
  if (mode == 0) {
    psStack_b00 = (secp256k1_strauss_point_state *)0x1695f4;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_920,(secp256k1_scalar *)local_ad8);
    psStack_b00 = (secp256k1_strauss_point_state *)0x16960b;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_9a0,(secp256k1_scalar *)auStack_af8);
    psStack_b00 = (secp256k1_strauss_point_state *)0x169622;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_a20,target);
  }
  else {
    psStack_b00 = (secp256k1_strauss_point_state *)0x1694b7;
    testutil_random_ge_test(&local_8a0);
    local_a68[10] = local_8a0.infinity;
    local_ad8._32_8_ = local_8a0.x.n[0];
    uStack_ab0 = local_8a0.x.n[1];
    local_aa8 = local_8a0.x.n[2];
    uStack_aa0 = local_8a0.x.n[3];
    local_a98 = local_8a0.x.n[4];
    local_a90 = local_8a0.y.n[0];
    uStack_a88 = local_8a0.y.n[1];
    local_a80 = local_8a0.y.n[2];
    uStack_a78 = local_8a0.y.n[3];
    local_a70 = local_8a0.y.n[4];
    local_a68[0] = 1;
    local_a68[1] = 0;
    local_a68[2] = 0;
    local_a68[3] = 0;
    local_a68[4] = 0;
    local_a68[5] = 0;
    local_a68[6] = 0;
    local_a68[7] = 0;
    local_a68[8] = 0;
    local_a68[9] = 0;
    if (mode == 1) {
      unaff_R12 = local_848;
      unaff_R13 = local_708;
      psVar5 = &local_448;
      psVar11 = &secp256k1_scalar_zero;
      psVar12 = (secp256k1_gej *)(local_ad8 + 0x20);
      psStack_b00 = (secp256k1_strauss_point_state *)0x16957a;
      local_9a0.x.n[0] = (uint64_t)unaff_R12;
      local_9a0.x.n[1] = (uint64_t)unaff_R13;
      local_9a0.x.n[2] = (uint64_t)psVar5;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_9a0,&local_920,1,psVar12,
                 (secp256k1_scalar *)local_ad8,&secp256k1_scalar_zero);
      psStack_b00 = (secp256k1_strauss_point_state *)0x1695a8;
      local_a20.x.n[0] = (uint64_t)unaff_R12;
      local_a20.x.n[1] = (uint64_t)unaff_R13;
      local_a20.x.n[2] = (uint64_t)psVar5;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_a20,&local_9a0,1,psVar12,
                 (secp256k1_scalar *)auStack_af8,&secp256k1_scalar_zero);
      psStack_b00 = (secp256k1_strauss_point_state *)0x1695d6;
      local_a38.aux = unaff_R12;
      local_a38.pre_a = unaff_R13;
      local_a38.ps = psVar5;
      secp256k1_ecmult_strauss_wnaf(&local_a38,&local_a20,1,psVar12,target,&secp256k1_scalar_zero);
    }
    else {
      psVar11 = (secp256k1_scalar *)&local_8a0;
      psStack_b00 = (secp256k1_strauss_point_state *)0x169641;
      secp256k1_ecmult_const(&local_920,(secp256k1_ge *)psVar11,(secp256k1_scalar *)local_ad8);
      psStack_b00 = (secp256k1_strauss_point_state *)0x169654;
      secp256k1_ecmult_const(&local_9a0,(secp256k1_ge *)psVar11,(secp256k1_scalar *)auStack_af8);
      psStack_b00 = (secp256k1_strauss_point_state *)0x169667;
      secp256k1_ecmult_const(&local_a20,(secp256k1_ge *)psVar11,target);
      psVar12 = (secp256k1_gej *)auStack_af8;
    }
  }
  psStack_b00 = (secp256k1_strauss_point_state *)0x169684;
  secp256k1_gej_add_var(&local_a20,&local_a20,&local_920,(secp256k1_fe *)0x0);
  psStack_b00 = (secp256k1_strauss_point_state *)0x169699;
  psVar8 = &local_a20;
  psVar9 = &local_a20;
  secp256k1_gej_add_var(&local_a20,&local_a20,&local_9a0,(secp256k1_fe *)0x0);
  if (local_a20.infinity != 0) {
    return;
  }
  psStack_b00 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar9 & 0xffffffff);
  apcStack_c68[0] = (code *)0x1696e9;
  psStack_c50 = psVar8;
  lStack_c48 = extraout_RDX;
  psStack_b28 = &local_a20;
  psStack_b20 = unaff_R12;
  psStack_b18 = unaff_R13;
  psStack_b10 = (secp256k1_ge *)psVar11;
  psStack_b08 = psVar12;
  psStack_b00 = psVar5;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  iStack_c56 = (int)psVar9;
  acc = &sStack_b90;
  sStack_b90.s[0] = 0x6a09e667;
  sStack_b90.s[1] = 0xbb67ae85;
  sStack_b90.s[2] = 0x3c6ef372;
  sStack_b90.s[3] = 0xa54ff53a;
  sStack_b90.s[4] = 0x510e527f;
  sStack_b90.s[5] = 0x9b05688c;
  sStack_b90.s[6] = 0x1f83d9ab;
  sStack_b90.s[7] = 0x5be0cd19;
  psVar8 = (secp256k1_gej *)0x0;
  sStack_b90.bytes = 0;
  psVar11 = (secp256k1_scalar *)(auStack_c40 + 0x20);
  auStack_c40._32_4_ = 0;
  auStack_c40._36_4_ = 0;
  aiStack_c18[0] = 0;
  aiStack_c18[1] = 0;
  aiStack_c18[2] = 0;
  aiStack_c18[3] = 0;
  aiStack_c18[4] = 0;
  aiStack_c18[5] = 0;
  apcStack_c68[0] = (code *)0x169739;
  test_ecmult_accumulate(acc,psVar11,scratch);
  auStack_c40._32_4_ = 1;
  auStack_c40._36_4_ = 0;
  aiStack_c18[0] = 0;
  aiStack_c18[1] = 0;
  aiStack_c18[2] = 0;
  aiStack_c18[3] = 0;
  aiStack_c18[4] = 0;
  aiStack_c18[5] = 0;
  apcStack_c68[0] = (code *)0x16975b;
  test_ecmult_accumulate(acc,psVar11,scratch);
  apcStack_c68[0] = (code *)0x169766;
  secp256k1_scalar_negate(psVar11,psVar11);
  apcStack_c68[0] = (code *)0x169777;
  test_ecmult_accumulate(acc,psVar11,scratch);
  psVar12 = psStack_c50;
  if (psStack_c50 != (secp256k1_gej *)0x0) {
    psVar8 = (secp256k1_gej *)0x0;
    acc = &sStack_c00;
    out32 = auStack_c40;
    do {
      uStack_c52 = SUB82(psVar8,0);
      sStack_c00.s[0] = 0x6a09e667;
      sStack_c00.s[1] = 0xbb67ae85;
      sStack_c00.s[2] = 0x3c6ef372;
      sStack_c00.s[3] = 0xa54ff53a;
      sStack_c00.s[4] = 0x510e527f;
      sStack_c00.s[5] = 0x9b05688c;
      sStack_c00.s[6] = 0x1f83d9ab;
      sStack_c00.s[7] = 0x5be0cd19;
      sStack_c00.bytes = 0;
      apcStack_c68[0] = (code *)0x1697d3;
      secp256k1_sha256_write(acc,(uchar *)&iStack_c56,6);
      apcStack_c68[0] = (code *)0x1697de;
      secp256k1_sha256_finalize(acc,out32);
      apcStack_c68[0] = (code *)0x1697eb;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_c40 + 0x20),out32,(int *)0x0);
      apcStack_c68[0] = (code *)0x1697fe;
      test_ecmult_accumulate(&sStack_b90,(secp256k1_scalar *)(auStack_c40 + 0x20),scratch);
      psVar8 = (secp256k1_gej *)((long)(psVar8->x).n + 1);
    } while (psVar12 != psVar8);
  }
  hash = &sStack_b90;
  psVar5 = (secp256k1_strauss_point_state *)auStack_c40;
  apcStack_c68[0] = (code *)0x169818;
  secp256k1_sha256_finalize(hash,(uchar *)psVar5);
  lVar2 = 0;
  while (auStack_c40[lVar2] == *(char *)(lStack_c48 + lVar2)) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x20) {
      apcStack_c68[0] = (code *)0x169845;
      secp256k1_scratch_destroy(&CTX->error_callback,scratch);
      return;
    }
  }
  apcStack_c68[0] = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_c70 = psVar12;
  auStack_1808 = (undefined1  [8])0x41;
  sStack_fd8.infinity = 0;
  sStack_fd8.x.n[0] = 0x2815b16f81798;
  sStack_fd8.x.n[1] = 0xdb2dce28d959f;
  sStack_fd8.x.n[2] = 0xe870b07029bfc;
  sStack_fd8.x.n[3] = 0xbbac55a06295c;
  sStack_fd8.x.n[4] = 0x79be667ef9dc;
  sStack_fd8.y.n[4] = 0x483ada7726a3;
  sStack_fd8.y.n[0] = 0x7d08ffb10d4b8;
  sStack_fd8.y.n[1] = 0x48a68554199c4;
  sStack_fd8.y.n[2] = 0xe1108a8fd17b4;
  sStack_fd8.y.n[3] = 0xc4655da4fbfc0;
  sStack_fd8.z.n[0] = 1;
  sStack_fd8.z.n[1] = 0;
  sStack_fd8.z.n[2] = 0;
  sStack_fd8.z.n[3] = 0;
  sStack_fd8.z.n[4] = 0;
  sStack_1058.infinity = 1;
  sStack_1058.z.n[4] = 0;
  sStack_1058.z.n[2] = 0;
  sStack_1058.z.n[3] = 0;
  sStack_1058.z.n[0] = 0;
  sStack_1058.z.n[1] = 0;
  sStack_1058.y.n[3] = 0;
  sStack_1058.y.n[4] = 0;
  sStack_1058.y.n[1] = 0;
  sStack_1058.y.n[2] = 0;
  sStack_1058.x.n[4] = 0;
  sStack_1058.y.n[0] = 0;
  sStack_1058.x.n[2] = 0;
  sStack_1058.x.n[3] = 0;
  sStack_1058.x.n[0] = 0;
  sStack_1058.x.n[1] = 0;
  psStack_1830 = (secp256k1_strauss_point_state *)0x16994d;
  auStack_f58._712_8_ = scratch;
  psStack_c88 = acc;
  puStack_c80 = auStack_c40 + 0x20;
  psStack_c78 = psVar8;
  apcStack_c68[0] = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1628,(secp256k1_scalar *)psVar5);
  r_00 = (secp256k1_strauss_point_state *)auStack_f58;
  psStack_1830 = (secp256k1_strauss_point_state *)0x16999a;
  sStack_1728.x.n[0] = (uint64_t)asStack_15a8;
  sStack_1728.x.n[1] = (uint64_t)r_00;
  sStack_1728.x.n[2] = (uint64_t)&sStack_1468;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1728,&sStack_16a8,1,&sStack_fd8,
             (secp256k1_scalar *)psVar5,&secp256k1_scalar_zero);
  psStack_1830 = (secp256k1_strauss_point_state *)0x1699cd;
  sStack_17a8.x.n[0] = (uint64_t)asStack_15a8;
  sStack_17a8.x.n[1] = (uint64_t)r_00;
  sStack_17a8.x.n[2] = (uint64_t)&sStack_1468;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_17a8,&sStack_1728,1,&sStack_1058,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar5);
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_strauss_point_state *)0x0;
  psStack_1830 = (secp256k1_strauss_point_state *)0x1699fc;
  psVar11 = (secp256k1_scalar *)psVar5;
  scratch_01 = scratch_00;
  iVar1 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)auStack_f58,(secp256k1_scalar *)psVar5,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar1 == 0) {
    psStack_1830 = (secp256k1_strauss_point_state *)0x169bdb;
    test_ecmult_accumulate_cold_8();
LAB_00169bdb:
    psStack_1830 = (secp256k1_strauss_point_state *)0x169be0;
    test_ecmult_accumulate_cold_7();
LAB_00169be0:
    psStack_1830 = (secp256k1_strauss_point_state *)0x169be5;
    test_ecmult_accumulate_cold_6();
LAB_00169be5:
    psStack_1830 = (secp256k1_strauss_point_state *)0x169bea;
    test_ecmult_accumulate_cold_5();
LAB_00169bea:
    psStack_1830 = (secp256k1_strauss_point_state *)0x169bef;
    test_ecmult_accumulate_cold_4();
LAB_00169bef:
    psStack_1830 = (secp256k1_strauss_point_state *)0x169bf4;
    test_ecmult_accumulate_cold_3();
LAB_00169bf4:
    psStack_1830 = (secp256k1_strauss_point_state *)0x169bf9;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar11 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169a37;
    scratch_01 = scratch_00;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = psVar5;
    iVar1 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_15a8,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar5,1);
    if (iVar1 == 0) goto LAB_00169bdb;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169a56;
    secp256k1_ecmult_const(&sStack_17a8,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar5);
    psVar5 = (secp256k1_strauss_point_state *)auStack_1800;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169a6b;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar5,&sStack_1628);
    r_00 = &sStack_1468;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169a83;
    secp256k1_gej_neg((secp256k1_gej *)r_00,&sStack_16a8);
    psVar11 = (secp256k1_scalar *)0x0;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169a93;
    scratch_01 = r_00;
    elem = r_00;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_00,(secp256k1_gej *)r_00,(secp256k1_ge *)psVar5,
               (secp256k1_fe *)0x0);
    if (sStack_1468.wnaf_na_1[0x1e] == 0) goto LAB_00169be0;
    psVar5 = &sStack_1468;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169ab6;
    secp256k1_gej_neg((secp256k1_gej *)psVar5,&sStack_1728);
    psVar11 = (secp256k1_scalar *)0x0;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169ac8;
    scratch_01 = psVar5;
    elem = psVar5;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar5,(secp256k1_gej *)psVar5,(secp256k1_ge *)auStack_1800,
               (secp256k1_fe *)0x0);
    if (sStack_1468.wnaf_na_1[0x1e] == 0) goto LAB_00169be5;
    psVar5 = &sStack_1468;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169aeb;
    secp256k1_gej_neg((secp256k1_gej *)psVar5,(secp256k1_gej *)auStack_f58);
    psVar11 = (secp256k1_scalar *)0x0;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169afd;
    scratch_01 = psVar5;
    elem = psVar5;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar5,(secp256k1_gej *)psVar5,(secp256k1_ge *)auStack_1800,
               (secp256k1_fe *)0x0);
    if (sStack_1468.wnaf_na_1[0x1e] == 0) goto LAB_00169bea;
    psVar5 = &sStack_1468;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169b20;
    secp256k1_gej_neg((secp256k1_gej *)psVar5,asStack_15a8);
    psVar11 = (secp256k1_scalar *)0x0;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169b32;
    scratch_01 = psVar5;
    elem = psVar5;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar5,(secp256k1_gej *)psVar5,(secp256k1_ge *)auStack_1800,
               (secp256k1_fe *)0x0);
    if (sStack_1468.wnaf_na_1[0x1e] == 0) goto LAB_00169bef;
    psVar5 = &sStack_1468;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169b55;
    secp256k1_gej_neg((secp256k1_gej *)psVar5,&sStack_17a8);
    psVar11 = (secp256k1_scalar *)0x0;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169b67;
    scratch_01 = psVar5;
    elem = psVar5;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar5,(secp256k1_gej *)psVar5,(secp256k1_ge *)auStack_1800,
               (secp256k1_fe *)0x0);
    if (sStack_1468.wnaf_na_1[0x1e] == 0) goto LAB_00169bf4;
    if (auStack_1800._80_4_ != 0) {
      sStack_1468.wnaf_na_1[0]._0_1_ = 0;
      sVar6 = 1;
LAB_00169bba:
      psStack_1830 = (secp256k1_strauss_point_state *)0x169bc4;
      secp256k1_sha256_write(hash,(uchar *)&sStack_1468,sVar6);
      return;
    }
    elem = (secp256k1_strauss_point_state *)auStack_1800;
    scratch_01 = &sStack_1468;
    psVar5 = (secp256k1_strauss_point_state *)auStack_1808;
    psVar11 = (secp256k1_scalar *)0x0;
    psStack_1830 = (secp256k1_strauss_point_state *)0x169ba7;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_01,(size_t *)psVar5,0);
    if (auStack_1808 == (undefined1  [8])0x41) {
      sVar6 = 0x41;
      goto LAB_00169bba;
    }
  }
  psStack_1830 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if ((secp256k1_strauss_point_state *)psVar11 != (secp256k1_strauss_point_state *)0x0 ||
      sStack_1820 != 0) {
    psStack_1850 = error_callback;
    psStack_1848 = &sStack_1058;
    psStack_1840 = psVar5;
    psStack_1838 = r_00;
    psStack_1830 = &sStack_1468;
    if (sStack_1820 == 0) {
      sStack_2088.aux = asStack_2070;
      sStack_2088.pre_a = asStack_1b20;
      sStack_2088.ps = &sStack_1f30;
      secp256k1_ecmult_strauss_wnaf(&sStack_2088,r,1,r,&secp256k1_scalar_zero,psVar11);
    }
    else {
      if ((scratch_01 == (secp256k1_strauss_point_state *)0x0) ||
         (sVar6 = secp256k1_pippenger_max_points
                            ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01), sVar6 == 0
         )) {
LAB_00169e53:
        secp256k1_ecmult_multi_simple_var(r,psVar11,cb,cbdata,sStack_1820);
        return;
      }
      uVar3 = 5000000;
      if (sVar6 < 5000000) {
        uVar3 = sVar6;
      }
      uVar10 = sStack_1820 - 1;
      uStack_2090 = uVar10 / uVar3 + 1;
      uVar3 = uVar10 / uStack_2090;
      if (uVar3 < 0x57) {
        lVar2 = 0;
        do {
          if (*(char *)((long)((secp256k1_fe *)scratch_01->wnaf_na_1)->n + lVar2) !=
              "scratch"[lVar2]) {
            (*(code *)((secp256k1_fe *)elem->wnaf_na_1)->n[0])
                      ("invalid scratch space",((secp256k1_fe *)elem->wnaf_na_1)->n[1]);
            goto LAB_00169e53;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
        uVar7 = ((secp256k1_fe *)scratch_01->wnaf_na_1)->n[3] -
                ((secp256k1_fe *)scratch_01->wnaf_na_1)->n[2];
        uVar3 = 0;
        if (0x4a < uVar7) {
          uVar3 = uVar7 - 0x4b;
        }
        if (uVar3 < 0x8b0) goto LAB_00169e53;
        uVar3 = uVar3 / 0x8b0;
        if (4999999 < uVar3) {
          uVar3 = 5000000;
        }
        uStack_2090 = uVar10 / uVar3 + 1;
        uVar3 = uVar10 / uStack_2090;
        pcVar4 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar4 = secp256k1_ecmult_pippenger_batch;
      }
      uVar3 = uVar3 + 1;
      lVar2 = 0;
      uVar10 = 0;
      do {
        uVar7 = uVar3;
        if (sStack_1820 < uVar3) {
          uVar7 = sStack_1820;
        }
        psVar5 = (secp256k1_strauss_point_state *)0x0;
        if (uVar10 == 0) {
          psVar5 = (secp256k1_strauss_point_state *)psVar11;
        }
        iVar1 = (*pcVar4)(elem,scratch_01,&sStack_1f30,psVar5,cb,cbdata,uVar7,lVar2);
        if (iVar1 == 0) {
          return;
        }
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1f30,(secp256k1_fe *)0x0);
        sStack_1820 = sStack_1820 - uVar7;
        uVar10 = uVar10 + 1;
        lVar2 = lVar2 + uVar3;
      } while (uStack_2090 != uVar10);
    }
  }
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}